

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void cjson_functions_shouldnt_crash_with_null_pointers(void)

{
  cJSON_bool cVar1;
  cJSON *item_00;
  cJSON *pcVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  cJSON *item;
  char buffer [10];
  
  buffer._2_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  item_00 = cJSON_CreateString("item");
  cJSON_InitHooks((cJSON_Hooks *)0x0);
  pcVar2 = cJSON_Parse((char *)0x0);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x163);
  }
  pcVar2 = cJSON_ParseWithOpts((char *)0x0,(char **)0x0,1);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x164);
  }
  pcVar3 = cJSON_Print((cJSON *)0x0);
  if (pcVar3 != (char *)0x0) {
    UnityFail(" Expected NULL",0x165);
  }
  pcVar3 = cJSON_PrintUnformatted((cJSON *)0x0);
  if (pcVar3 != (char *)0x0) {
    UnityFail(" Expected NULL",0x166);
  }
  pcVar3 = cJSON_PrintBuffered((cJSON *)0x0,10,1);
  if (pcVar3 != (char *)0x0) {
    UnityFail(" Expected NULL",0x167);
  }
  cVar1 = cJSON_PrintPreallocated((cJSON *)0x0,(char *)((long)&item + 6),10,1);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x168);
  }
  cVar1 = cJSON_PrintPreallocated(item_00,(char *)0x0,1,1);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x169);
  }
  cJSON_Delete((cJSON *)0x0);
  cJSON_GetArraySize((cJSON *)0x0);
  pcVar2 = cJSON_GetArrayItem((cJSON *)0x0,0);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x16c);
  }
  pcVar2 = cJSON_GetObjectItem((cJSON *)0x0,"item");
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x16d);
  }
  pcVar2 = cJSON_GetObjectItem(item_00,(char *)0x0);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x16e);
  }
  pcVar2 = cJSON_GetObjectItemCaseSensitive((cJSON *)0x0,"item");
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x16f);
  }
  pcVar2 = cJSON_GetObjectItemCaseSensitive(item_00,(char *)0x0);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x170);
  }
  cVar1 = cJSON_HasObjectItem((cJSON *)0x0,"item");
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x171);
  }
  cVar1 = cJSON_HasObjectItem(item_00,(char *)0x0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x172);
  }
  cVar1 = cJSON_IsInvalid((cJSON *)0x0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x173);
  }
  cVar1 = cJSON_IsFalse((cJSON *)0x0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x174);
  }
  cVar1 = cJSON_IsTrue((cJSON *)0x0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x175);
  }
  cVar1 = cJSON_IsBool((cJSON *)0x0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x176);
  }
  cVar1 = cJSON_IsNull((cJSON *)0x0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x177);
  }
  cVar1 = cJSON_IsNumber((cJSON *)0x0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x178);
  }
  cVar1 = cJSON_IsString((cJSON *)0x0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x179);
  }
  cVar1 = cJSON_IsArray((cJSON *)0x0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x17a);
  }
  cVar1 = cJSON_IsObject((cJSON *)0x0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x17b);
  }
  cVar1 = cJSON_IsRaw((cJSON *)0x0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x17c);
  }
  pcVar2 = cJSON_CreateString((char *)0x0);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x17d);
  }
  pcVar2 = cJSON_CreateRaw((char *)0x0);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x17e);
  }
  pcVar2 = cJSON_CreateIntArray((int *)0x0,10);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x17f);
  }
  pcVar2 = cJSON_CreateFloatArray((float *)0x0,10);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x180);
  }
  pcVar2 = cJSON_CreateDoubleArray((double *)0x0,10);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x181);
  }
  pcVar2 = cJSON_CreateStringArray((char **)0x0,10);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x182);
  }
  cJSON_AddItemToArray((cJSON *)0x0,item_00);
  cJSON_AddItemToArray(item_00,(cJSON *)0x0);
  cJSON_AddItemToObject(item_00,"item",(cJSON *)0x0);
  cJSON_AddItemToObject(item_00,(char *)0x0,item_00);
  cJSON_AddItemToObject((cJSON *)0x0,"item",item_00);
  cJSON_AddItemToObjectCS(item_00,"item",(cJSON *)0x0);
  cJSON_AddItemToObjectCS(item_00,(char *)0x0,item_00);
  cJSON_AddItemToObjectCS((cJSON *)0x0,"item",item_00);
  cJSON_AddItemReferenceToArray((cJSON *)0x0,item_00);
  cJSON_AddItemReferenceToArray(item_00,(cJSON *)0x0);
  cJSON_AddItemReferenceToObject(item_00,"item",(cJSON *)0x0);
  cJSON_AddItemReferenceToObject(item_00,(char *)0x0,item_00);
  cJSON_AddItemReferenceToObject((cJSON *)0x0,"item",item_00);
  pcVar2 = cJSON_DetachItemViaPointer((cJSON *)0x0,item_00);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",400);
  }
  pcVar2 = cJSON_DetachItemViaPointer(item_00,(cJSON *)0x0);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x191);
  }
  pcVar2 = cJSON_DetachItemFromArray((cJSON *)0x0,0);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x192);
  }
  cJSON_DeleteItemFromArray((cJSON *)0x0,0);
  pcVar2 = cJSON_DetachItemFromObject((cJSON *)0x0,"item");
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x194);
  }
  pcVar2 = cJSON_DetachItemFromObject(item_00,(char *)0x0);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x195);
  }
  pcVar2 = cJSON_DetachItemFromObjectCaseSensitive((cJSON *)0x0,"item");
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x196);
  }
  pcVar2 = cJSON_DetachItemFromObjectCaseSensitive(item_00,(char *)0x0);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x197);
  }
  cJSON_DeleteItemFromObject((cJSON *)0x0,"item");
  cJSON_DeleteItemFromObject(item_00,(char *)0x0);
  cJSON_DeleteItemFromObjectCaseSensitive((cJSON *)0x0,"item");
  cJSON_DeleteItemFromObjectCaseSensitive(item_00,(char *)0x0);
  cJSON_InsertItemInArray((cJSON *)0x0,0,item_00);
  cJSON_InsertItemInArray(item_00,0,(cJSON *)0x0);
  cVar1 = cJSON_ReplaceItemViaPointer((cJSON *)0x0,item_00,item_00);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x19e);
  }
  cVar1 = cJSON_ReplaceItemViaPointer(item_00,(cJSON *)0x0,item_00);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x19f);
  }
  cVar1 = cJSON_ReplaceItemViaPointer(item_00,item_00,(cJSON *)0x0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x1a0);
  }
  cJSON_ReplaceItemInArray(item_00,0,(cJSON *)0x0);
  cJSON_ReplaceItemInArray((cJSON *)0x0,0,item_00);
  cJSON_ReplaceItemInObject((cJSON *)0x0,"item",item_00);
  cJSON_ReplaceItemInObject(item_00,(char *)0x0,item_00);
  cJSON_ReplaceItemInObject(item_00,"item",(cJSON *)0x0);
  cJSON_ReplaceItemInObjectCaseSensitive((cJSON *)0x0,"item",item_00);
  cJSON_ReplaceItemInObjectCaseSensitive(item_00,(char *)0x0,item_00);
  cJSON_ReplaceItemInObjectCaseSensitive(item_00,"item",(cJSON *)0x0);
  pcVar2 = cJSON_Duplicate((cJSON *)0x0,1);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x1a9);
  }
  cVar1 = cJSON_Compare(item_00,(cJSON *)0x0,0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x1aa);
  }
  cVar1 = cJSON_Compare((cJSON *)0x0,item_00,0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x1ab);
  }
  cJSON_Minify((char *)0x0);
  cJSON_Delete(item_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != buffer._2_8_) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void cjson_functions_shouldnt_crash_with_null_pointers(void)
{
    char buffer[10];
    cJSON *item = cJSON_CreateString("item");

    cJSON_InitHooks(NULL);
    TEST_ASSERT_NULL(cJSON_Parse(NULL));
    TEST_ASSERT_NULL(cJSON_ParseWithOpts(NULL, NULL, true));
    TEST_ASSERT_NULL(cJSON_Print(NULL));
    TEST_ASSERT_NULL(cJSON_PrintUnformatted(NULL));
    TEST_ASSERT_NULL(cJSON_PrintBuffered(NULL, 10, true));
    TEST_ASSERT_FALSE(cJSON_PrintPreallocated(NULL, buffer, sizeof(buffer), true));
    TEST_ASSERT_FALSE(cJSON_PrintPreallocated(item, NULL, 1, true));
    cJSON_Delete(NULL);
    cJSON_GetArraySize(NULL);
    TEST_ASSERT_NULL(cJSON_GetArrayItem(NULL, 0));
    TEST_ASSERT_NULL(cJSON_GetObjectItem(NULL, "item"));
    TEST_ASSERT_NULL(cJSON_GetObjectItem(item, NULL));
    TEST_ASSERT_NULL(cJSON_GetObjectItemCaseSensitive(NULL, "item"));
    TEST_ASSERT_NULL(cJSON_GetObjectItemCaseSensitive(item, NULL));
    TEST_ASSERT_FALSE(cJSON_HasObjectItem(NULL, "item"));
    TEST_ASSERT_FALSE(cJSON_HasObjectItem(item, NULL));
    TEST_ASSERT_FALSE(cJSON_IsInvalid(NULL));
    TEST_ASSERT_FALSE(cJSON_IsFalse(NULL));
    TEST_ASSERT_FALSE(cJSON_IsTrue(NULL));
    TEST_ASSERT_FALSE(cJSON_IsBool(NULL));
    TEST_ASSERT_FALSE(cJSON_IsNull(NULL));
    TEST_ASSERT_FALSE(cJSON_IsNumber(NULL));
    TEST_ASSERT_FALSE(cJSON_IsString(NULL));
    TEST_ASSERT_FALSE(cJSON_IsArray(NULL));
    TEST_ASSERT_FALSE(cJSON_IsObject(NULL));
    TEST_ASSERT_FALSE(cJSON_IsRaw(NULL));
    TEST_ASSERT_NULL(cJSON_CreateString(NULL));
    TEST_ASSERT_NULL(cJSON_CreateRaw(NULL));
    TEST_ASSERT_NULL(cJSON_CreateIntArray(NULL, 10));
    TEST_ASSERT_NULL(cJSON_CreateFloatArray(NULL, 10));
    TEST_ASSERT_NULL(cJSON_CreateDoubleArray(NULL, 10));
    TEST_ASSERT_NULL(cJSON_CreateStringArray(NULL, 10));
    cJSON_AddItemToArray(NULL, item);
    cJSON_AddItemToArray(item, NULL);
    cJSON_AddItemToObject(item, "item", NULL);
    cJSON_AddItemToObject(item, NULL, item);
    cJSON_AddItemToObject(NULL, "item", item);
    cJSON_AddItemToObjectCS(item, "item", NULL);
    cJSON_AddItemToObjectCS(item, NULL, item);
    cJSON_AddItemToObjectCS(NULL, "item", item);
    cJSON_AddItemReferenceToArray(NULL, item);
    cJSON_AddItemReferenceToArray(item, NULL);
    cJSON_AddItemReferenceToObject(item, "item", NULL);
    cJSON_AddItemReferenceToObject(item, NULL, item);
    cJSON_AddItemReferenceToObject(NULL, "item", item);
    TEST_ASSERT_NULL(cJSON_DetachItemViaPointer(NULL, item));
    TEST_ASSERT_NULL(cJSON_DetachItemViaPointer(item, NULL));
    TEST_ASSERT_NULL(cJSON_DetachItemFromArray(NULL, 0));
    cJSON_DeleteItemFromArray(NULL, 0);
    TEST_ASSERT_NULL(cJSON_DetachItemFromObject(NULL, "item"));
    TEST_ASSERT_NULL(cJSON_DetachItemFromObject(item, NULL));
    TEST_ASSERT_NULL(cJSON_DetachItemFromObjectCaseSensitive(NULL, "item"));
    TEST_ASSERT_NULL(cJSON_DetachItemFromObjectCaseSensitive(item, NULL));
    cJSON_DeleteItemFromObject(NULL, "item");
    cJSON_DeleteItemFromObject(item, NULL);
    cJSON_DeleteItemFromObjectCaseSensitive(NULL, "item");
    cJSON_DeleteItemFromObjectCaseSensitive(item, NULL);
    cJSON_InsertItemInArray(NULL, 0, item);
    cJSON_InsertItemInArray(item, 0, NULL);
    TEST_ASSERT_FALSE(cJSON_ReplaceItemViaPointer(NULL, item, item));
    TEST_ASSERT_FALSE(cJSON_ReplaceItemViaPointer(item, NULL, item));
    TEST_ASSERT_FALSE(cJSON_ReplaceItemViaPointer(item, item, NULL));
    cJSON_ReplaceItemInArray(item, 0, NULL);
    cJSON_ReplaceItemInArray(NULL, 0, item);
    cJSON_ReplaceItemInObject(NULL, "item", item);
    cJSON_ReplaceItemInObject(item, NULL, item);
    cJSON_ReplaceItemInObject(item, "item", NULL);
    cJSON_ReplaceItemInObjectCaseSensitive(NULL, "item", item);
    cJSON_ReplaceItemInObjectCaseSensitive(item, NULL, item);
    cJSON_ReplaceItemInObjectCaseSensitive(item, "item", NULL);
    TEST_ASSERT_NULL(cJSON_Duplicate(NULL, true));
    TEST_ASSERT_FALSE(cJSON_Compare(item, NULL, false));
    TEST_ASSERT_FALSE(cJSON_Compare(NULL, item, false));
    cJSON_Minify(NULL);
    /* skipped because it is only used via a macro that checks for NULL */
    /* cJSON_SetNumberHelper(NULL, 0); */

    cJSON_Delete(item);
}